

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cw-out.c
# Opt level: O3

CURLcode cw_out_flush(Curl_easy *data,Curl_cwriter *cw_out,_Bool flush_all)

{
  CURLcode CVar1;
  _Bool in_CL;
  CURLcode CVar2;
  
  CVar2 = CURLE_WRITE_ERROR;
  if (((ulong)cw_out[1].next & 2) == 0) {
    CVar2 = CURLE_OK;
    if (((ulong)cw_out[1].next & 1) == 0) {
      CVar1 = cw_out_flush_chain((cw_out_ctx *)cw_out,data,(cw_out_buf **)(cw_out + 1),in_CL);
      CVar2 = CURLE_OK;
      if (CVar1 != CURLE_OK) {
        *(byte *)&cw_out[1].next = *(byte *)&cw_out[1].next | 2;
        cw_out_bufs_free((cw_out_ctx *)cw_out);
        CVar2 = CVar1;
      }
    }
  }
  return CVar2;
}

Assistant:

static CURLcode cw_out_flush(struct Curl_easy *data,
                             struct Curl_cwriter *cw_out,
                             bool flush_all)
{
  struct cw_out_ctx *ctx = (struct cw_out_ctx *)cw_out;
  CURLcode result = CURLE_OK;

  if(ctx->errored)
    return CURLE_WRITE_ERROR;
  if(ctx->paused)
    return CURLE_OK;  /* not doing it */

  result = cw_out_flush_chain(ctx, data, &ctx->buf, flush_all);
  if(result) {
    ctx->errored = TRUE;
    cw_out_bufs_free(ctx);
    return result;
  }
  return result;
}